

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::TiledInputFile::initialize(TiledInputFile *this)

{
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *pvVar1;
  int maxX;
  int minY;
  int maxY;
  uint uVar2;
  size_t __n;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  bool bVar5;
  int iVar6;
  Format FVar7;
  string *psVar8;
  ArgExc *this_00;
  TileDescription *pTVar9;
  LineOrder *pLVar10;
  Box2i *pBVar11;
  size_t sVar12;
  TileBuffer *pTVar13;
  Compression *pCVar14;
  Compressor *compressor;
  char *pcVar15;
  ulong uVar16;
  Data *pDVar17;
  TileOffsets local_70;
  undefined1 local_48 [16];
  pointer local_38;
  
  if ((this->_data->version & 0x1a00U) == 0x200) {
    bVar5 = Header::hasType(&this->_data->header);
    if (bVar5) {
      Header::setType(&this->_data->header,(string *)&TILEDIMAGE_abi_cxx11_);
    }
  }
  pDVar17 = this->_data;
  if (pDVar17->partNumber == -1) {
    if ((pDVar17->version & 0x200) != 0) goto LAB_0014ed57;
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "Expected a tiled file but the file is not tiled.";
  }
  else {
    bVar5 = Header::hasType(&pDVar17->header);
    if (!bVar5) goto LAB_0014ed57;
    psVar8 = Header::type_abi_cxx11_(&this->_data->header);
    __n = psVar8->_M_string_length;
    if (__n == DAT_003819e0) {
      if (__n == 0) {
LAB_0014ed57:
        Header::sanityCheck(&this->_data->header,true,false);
        pTVar9 = Header::tileDescription(&this->_data->header);
        pDVar17 = this->_data;
        uVar2 = pTVar9->ySize;
        LVar3 = pTVar9->mode;
        LVar4 = pTVar9->roundingMode;
        (pDVar17->tileDesc).xSize = pTVar9->xSize;
        (pDVar17->tileDesc).ySize = uVar2;
        (pDVar17->tileDesc).mode = LVar3;
        (pDVar17->tileDesc).roundingMode = LVar4;
        pLVar10 = Header::lineOrder(&this->_data->header);
        pDVar17 = this->_data;
        pDVar17->lineOrder = *pLVar10;
        pBVar11 = Header::dataWindow(&pDVar17->header);
        iVar6 = (pBVar11->min).x;
        pDVar17 = this->_data;
        pDVar17->minX = iVar6;
        maxX = (pBVar11->max).x;
        pDVar17->maxX = maxX;
        minY = (pBVar11->min).y;
        pDVar17->minY = minY;
        maxY = (pBVar11->max).y;
        pDVar17->maxY = maxY;
        precalculateTileInfo
                  (&pDVar17->tileDesc,iVar6,maxX,minY,maxY,&pDVar17->numXTiles,&pDVar17->numYTiles,
                   &pDVar17->numXLevels,&pDVar17->numYLevels);
        sVar12 = calculateBytesPerPixel(&this->_data->header);
        pDVar17 = this->_data;
        pDVar17->bytesPerPixel = sVar12;
        uVar2 = (pDVar17->tileDesc).ySize;
        sVar12 = (pDVar17->tileDesc).xSize * sVar12;
        pDVar17->maxBytesPerTileLine = sVar12;
        pDVar17->tileBufferSize = uVar2 * sVar12;
        pDVar17 = this->_data;
        if ((pDVar17->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pDVar17->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar16 = 0;
          do {
            pTVar13 = (TileBuffer *)operator_new(0x80);
            pCVar14 = Header::compression(&pDVar17->header);
            pDVar17 = this->_data;
            compressor = newTileCompressor(*pCVar14,pDVar17->maxBytesPerTileLine,
                                           (ulong)(pDVar17->tileDesc).ySize,&pDVar17->header);
            pTVar13->uncompressedData = (char *)0x0;
            pTVar13->buffer = (char *)0x0;
            pTVar13->dataSize = 0;
            pTVar13->compressor = compressor;
            FVar7 = defaultFormat(compressor);
            pTVar13->format = FVar7;
            pTVar13->dx = -1;
            pTVar13->dy = -1;
            pTVar13->lx = -1;
            pTVar13->ly = -1;
            pTVar13->hasException = false;
            (pTVar13->exception)._M_dataplus._M_p = (pointer)&(pTVar13->exception).field_2;
            (pTVar13->exception)._M_string_length = 0;
            (pTVar13->exception).field_2._M_local_buf[0] = '\0';
            IlmThread_2_5::Semaphore::Semaphore(&pTVar13->_sem,1);
            (this->_data->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar16] = pTVar13;
            iVar6 = (*this->_data->_streamData->is->_vptr_IStream[2])();
            if ((char)iVar6 == '\0') {
              pDVar17 = this->_data;
              pcVar15 = (char *)operator_new__(pDVar17->tileBufferSize);
              (pDVar17->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16]->buffer = pcVar15;
            }
            uVar16 = uVar16 + 1;
            pDVar17 = this->_data;
          } while (uVar16 < (ulong)((long)(pDVar17->tileBuffers).
                                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pDVar17->tileBuffers).
                                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        TileOffsets::TileOffsets
                  (&local_70,(pDVar17->tileDesc).mode,pDVar17->numXLevels,pDVar17->numYLevels,
                   pDVar17->numXTiles,pDVar17->numYTiles);
        pDVar17 = this->_data;
        (pDVar17->tileOffsets)._numYLevels = local_70._numYLevels;
        (pDVar17->tileOffsets)._mode = local_70._mode;
        (pDVar17->tileOffsets)._numXLevels = local_70._numXLevels;
        pvVar1 = &(pDVar17->tileOffsets)._offsets;
        local_48._0_8_ =
             (pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_48._8_8_ =
             (pvVar1->
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_38 = (pDVar17->tileOffsets)._offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pDVar17->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pDVar17->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pDVar17->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)local_48);
        std::
        vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_70._offsets);
        return;
      }
      iVar6 = bcmp((psVar8->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
      if (iVar6 == 0) goto LAB_0014ed57;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "TiledInputFile used for non-tiledimage part.";
  }
  Iex_2_5::ArgExc::ArgExc(this_00,pcVar15);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::initialize ()
{
    // fix bad types in header (arises when a tool built against an older version of
    // OpenEXR converts a scanline image to tiled)
    // only applies when file is a single part, regular image, tiled file
    //
    if(!isMultiPart(_data->version) &&
       !isNonImage(_data->version) && 
       isTiled(_data->version) && 
       _data->header.hasType() )
    {
        _data->header.setType(TILEDIMAGE);
    }
    
    if (_data->partNumber == -1)
    {
        if (!isTiled (_data->version))
            throw IEX_NAMESPACE::ArgExc ("Expected a tiled file but the file is not tiled.");
        
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()!=TILEDIMAGE)
        {
            throw IEX_NAMESPACE::ArgExc ("TiledInputFile used for non-tiledimage part.");
        }
    }
    
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //
    
    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);    

    _data->bytesPerPixel = calculateBytesPerPixel (_data->header);

    _data->maxBytesPerTileLine = _data->bytesPerPixel * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        if (!_data->_streamData->is->isMemoryMapped ())
            _data->tileBuffers[i]->buffer = new char [_data->tileBufferSize];
    }

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}